

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int curl_mvsnprintf(char *buffer,size_t maxlength,char *format,__va_list_tag *ap_save)

{
  int iVar1;
  char *local_48;
  nsprintf info;
  int retcode;
  __va_list_tag *ap_save_local;
  char *format_local;
  size_t maxlength_local;
  char *buffer_local;
  
  info.buffer = (char *)0x0;
  local_48 = buffer;
  info.length = maxlength;
  iVar1 = dprintf_formatf(&local_48,addbyter,format,ap_save);
  if ((iVar1 != -1) && (info.length != 0)) {
    if ((char *)info.length == info.buffer) {
      local_48[-1] = '\0';
    }
    else {
      *local_48 = '\0';
    }
  }
  return iVar1;
}

Assistant:

int curl_mvsnprintf(char *buffer, size_t maxlength, const char *format,
                    va_list ap_save)
{
  int retcode;
  struct nsprintf info;

  info.buffer = buffer;
  info.length = 0;
  info.max = maxlength;

  retcode = dprintf_formatf(&info, addbyter, format, ap_save);
  if((retcode != -1) && info.max) {
    /* we terminate this with a zero byte */
    if(info.max == info.length)
      /* we're at maximum, scrap the last letter */
      info.buffer[-1] = 0;
    else
      info.buffer[0] = 0;
  }
  return retcode;
}